

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_booke206_tlbivax_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  int flags;
  bool bVar1;
  
  if ((address & 4) != 0) {
    bVar1 = (address & 8) != 0;
    if (bVar1) {
      flags = 2;
    }
    else {
      flags = 1;
    }
    booke206_flush_tlb(env,flags,(uint)bVar1);
    return;
  }
  cpu = &env[-1].spr_cb[0x1bf].oea_write;
  if ((address & 8) == 0) {
    booke206_invalidate_ea_tlb(env,0,(uint32_t)address);
    tlb_flush_page_ppc64((CPUState *)cpu,address & 0xfffffffffffff000);
    return;
  }
  booke206_invalidate_ea_tlb(env,1,(uint32_t)address);
  tlb_flush_ppc64((CPUState *)cpu);
  return;
}

Assistant:

void helper_booke206_tlbivax(CPUPPCState *env, target_ulong address)
{
    CPUState *cs = env_cpu(env);

    if (address & 0x4) {
        /* flush all entries */
        if (address & 0x8) {
            /* flush all of TLB1 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB1, 1);
        } else {
            /* flush all of TLB0 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB0, 0);
        }
        return;
    }

    if (address & 0x8) {
        /* flush TLB1 entries */
        booke206_invalidate_ea_tlb(env, 1, address);
        tlb_flush(cs);
    } else {
        /* flush TLB0 entries */
        booke206_invalidate_ea_tlb(env, 0, address);
        tlb_flush_page(cs, address & MAS2_EPN_MASK);
    }
}